

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Group.cpp
# Opt level: O2

Group * __thiscall adios2::core::Group::InquireGroup(Group *this,string *groupName)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  iVar1 = std::__cxx11::string::compare((char *)this);
  if (iVar1 != 0) {
    std::operator+(&local_38,&this->currentPath,this->groupDelimiter);
    std::operator+(&bStack_58,&local_38,groupName);
    std::__cxx11::string::operator=((string *)groupName,(string *)&bStack_58);
    std::__cxx11::string::~string((string *)&bStack_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  std::make_shared<adios2::core::Group,std::__cxx11::string&,char&,adios2::core::IO&>
            (&bStack_58,(char *)groupName,(IO *)&this->groupDelimiter);
  std::__shared_ptr<adios2::core::Group,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_Gr).super___shared_ptr<adios2::core::Group,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<adios2::core::Group,_(__gnu_cxx::_Lock_policy)2> *)&bStack_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&bStack_58._M_string_length);
  std::__shared_ptr<adios2::core::Group::TreeMap,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(((this->m_Gr).super___shared_ptr<adios2::core::Group,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->mapPtr).
              super___shared_ptr<adios2::core::Group::TreeMap,_(__gnu_cxx::_Lock_policy)2>,
             &(this->mapPtr).
              super___shared_ptr<adios2::core::Group::TreeMap,_(__gnu_cxx::_Lock_policy)2>);
  return (this->m_Gr).super___shared_ptr<adios2::core::Group,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
}

Assistant:

Group *Group::InquireGroup(std::string groupName)
{
    if (currentPath.compare("") != 0)
    {
        groupName = currentPath + groupDelimiter + groupName;
    }
    m_Gr = std::make_shared<Group>(groupName, this->groupDelimiter, this->m_IO);
    m_Gr->mapPtr = this->mapPtr;
    return m_Gr.get();
}